

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

AtanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_atan(NeuralNetworkLayer *this)

{
  ulong uVar1;
  AtanLayerParams *pAVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x2e4) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2e4;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pAVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::AtanLayerParams>
                       (arena);
    (this->layer_).atan_ = pAVar2;
  }
  return (AtanLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AtanLayerParams* NeuralNetworkLayer::_internal_mutable_atan() {
  if (!_internal_has_atan()) {
    clear_layer();
    set_has_atan();
    layer_.atan_ = CreateMaybeMessage< ::CoreML::Specification::AtanLayerParams >(GetArenaForAllocation());
  }
  return layer_.atan_;
}